

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall google::protobuf::MessageLite::LogInitializationErrorMessage(MessageLite *this)

{
  LogMessage *other;
  MessageLite *message;
  LogFinisher local_75 [13];
  string local_68;
  LogMessage local_48;
  MessageLite *local_10;
  MessageLite *this_local;
  
  message = (MessageLite *)0x85;
  local_10 = this;
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_ERROR,"third_party/protobuf-lite/message_lite.cc",0x85);
  (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
            (&local_68,(_anonymous_namespace_ *)"parse",(char *)this,message);
  other = internal::LogMessage::operator<<(&local_48,&local_68);
  internal::LogFinisher::operator=(local_75,other);
  std::__cxx11::string::~string((string *)&local_68);
  internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void MessageLite::LogInitializationErrorMessage() const {
  GOOGLE_LOG(ERROR) << InitializationErrorMessage("parse", *this);
}